

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall RefTable::AllocNodes(RefTable *this,SQUnsignedInteger size)

{
  RefNode *pRVar1;
  RefNode **ppRVar2;
  SQUnsignedInteger SVar3;
  
  ppRVar2 = (RefNode **)sq_vm_malloc(size * 0x28);
  pRVar1 = (RefNode *)(ppRVar2 + size);
  for (SVar3 = 1; size != SVar3; SVar3 = SVar3 + 1) {
    ppRVar2[SVar3 - 1] = (RefNode *)0x0;
    *(undefined4 *)&pRVar1->obj = 0x1000001;
    *(RefNode **)((long)&pRVar1->obj + 8) = (RefNode *)0x0;
    pRVar1->refs = 0;
    pRVar1->next = pRVar1 + 1;
    pRVar1 = pRVar1 + 1;
  }
  ppRVar2[size - 1] = (RefNode *)0x0;
  *(undefined4 *)&pRVar1->obj = 0x1000001;
  ((SQObjectValue *)((long)&pRVar1->obj + 8))->pTable = (SQTable *)0x0;
  pRVar1->refs = 0;
  pRVar1->next = (RefNode *)0x0;
  this->_freelist = (RefNode *)(ppRVar2 + size);
  this->_nodes = (RefNode *)(ppRVar2 + size);
  this->_buckets = ppRVar2;
  this->_slotused = 0;
  this->_numofslots = size;
  return;
}

Assistant:

void RefTable::AllocNodes(SQUnsignedInteger size)
{
    RefNode **bucks;
    RefNode *nodes;
    bucks = (RefNode **)SQ_MALLOC((size * sizeof(RefNode *)) + (size * sizeof(RefNode)));
    nodes = (RefNode *)&bucks[size];
    RefNode *temp = nodes;
    SQUnsignedInteger n;
    for(n = 0; n < size - 1; n++) {
        bucks[n] = NULL;
        temp->refs = 0;
        new (&temp->obj) SQObjectPtr;
        temp->next = temp+1;
        temp++;
    }
    bucks[n] = NULL;
    temp->refs = 0;
    new (&temp->obj) SQObjectPtr;
    temp->next = NULL;
    _freelist = nodes;
    _nodes = nodes;
    _buckets = bucks;
    _slotused = 0;
    _numofslots = size;
}